

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void emit_buffered_bits(huff_entropy_ptr_conflict entropy,char *bufstart,uint nbits)

{
  uint local_1c;
  char *pcStack_18;
  uint nbits_local;
  char *bufstart_local;
  huff_entropy_ptr_conflict entropy_local;
  
  local_1c = nbits;
  pcStack_18 = bufstart;
  if (entropy->gather_statistics == 0) {
    for (; local_1c != 0; local_1c = local_1c - 1) {
      emit_bits_e(entropy,(int)*pcStack_18,1);
      pcStack_18 = pcStack_18 + 1;
    }
  }
  return;
}

Assistant:

LOCAL(void)
emit_buffered_bits (huff_entropy_ptr entropy, char * bufstart,
		    unsigned int nbits)
{
  if (entropy->gather_statistics)
    return;			/* no real work */

  while (nbits > 0) {
    emit_bits_e(entropy, (unsigned int) (*bufstart), 1);
    bufstart++;
    nbits--;
  }
}